

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

CoatedDiffuseMaterial *
pbrt::CoatedDiffuseMaterial::Create
          (TextureParameterDictionary *parameters,Image *normalMap,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  CoatedDiffuseMaterial *pCVar5;
  undefined8 in_RCX;
  string *in_RDI;
  bool remapRoughness;
  FloatTexture displacement;
  SpectrumTexture albedo;
  FloatTexture g;
  int nSamples;
  int maxDepth;
  Spectrum eta;
  FloatTexture thickness;
  FloatTexture vRoughness;
  FloatTexture uRoughness;
  SpectrumTexture reflectance;
  string *in_stack_fffffffffffffac8;
  string *in_stack_fffffffffffffad0;
  TextureParameterDictionary *in_stack_fffffffffffffad8;
  vector<float,_std::allocator<float>_> *in_stack_fffffffffffffae0;
  string *in_stack_fffffffffffffae8;
  TextureParameterDictionary *in_stack_fffffffffffffaf0;
  Allocator in_stack_fffffffffffffaf8;
  undefined7 in_stack_fffffffffffffb00;
  undefined1 in_stack_fffffffffffffb07;
  string *in_stack_fffffffffffffb08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  Allocator in_stack_fffffffffffffb18;
  string *psVar6;
  FloatTexture *args_2;
  string *in_stack_fffffffffffffb28;
  string *name;
  TextureParameterDictionary *in_stack_fffffffffffffb30;
  TextureParameterDictionary *this_00;
  Allocator in_stack_fffffffffffffb38;
  Allocator alloc_00;
  Spectrum *in_stack_fffffffffffffb40;
  Spectrum *defaultValue;
  undefined4 in_stack_fffffffffffffb48;
  undefined4 in_stack_fffffffffffffb4c;
  TextureParameterDictionary *in_stack_fffffffffffffb50;
  Allocator in_stack_fffffffffffffb58;
  Allocator alloc_01;
  FloatTexture *args_5;
  string *in_stack_fffffffffffffb78;
  FloatTexture *in_stack_fffffffffffffb80;
  ConstantSpectrum *in_stack_fffffffffffffb88;
  string *in_stack_fffffffffffffb90;
  allocator<char> *in_stack_fffffffffffffb98;
  undefined7 in_stack_fffffffffffffba0;
  undefined1 local_3e1 [40];
  byte local_3b9;
  undefined8 local_3b8;
  undefined8 local_3a9;
  undefined4 local_37c;
  ConstantSpectrum *local_378;
  undefined8 local_368;
  undefined1 local_351 [33];
  TaggedPointer local_330 [8];
  undefined8 local_328;
  undefined8 local_319;
  undefined8 local_2e9;
  int local_2c8;
  undefined8 local_2c1;
  int local_2a0;
  undefined4 local_29c;
  undefined8 local_290;
  undefined8 local_279;
  allocator<char> local_249;
  string local_248 [32];
  vector<float,_std::allocator<float>_> local_228;
  allocator<char> local_201;
  string local_200 [56];
  TaggedPointer local_1c8 [8];
  undefined8 local_1c0;
  allocator<char> local_1b1;
  string local_1b0 [40];
  undefined8 local_188;
  allocator<char> local_179;
  string local_178 [40];
  undefined8 local_150;
  allocator<char> local_141;
  string local_140 [40];
  undefined8 local_118;
  allocator<char> local_109;
  string local_108 [32];
  TaggedPointer local_e8 [8];
  undefined8 local_e0;
  allocator<char> local_d1;
  string local_d0 [32];
  TaggedPointer local_b0 [12];
  undefined4 local_a4;
  ConstantSpectrum *local_a0;
  undefined8 local_90;
  allocator<char> local_69;
  string local_68 [32];
  TaggedPointer local_48 [24];
  string *local_30;
  undefined8 local_28;
  
  local_30 = in_RDI;
  local_28 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_90 = local_28;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffb50,
             (string *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             in_stack_fffffffffffffb40,
             (SpectrumType)((ulong)in_stack_fffffffffffffb38.memoryResource >> 0x20),
             in_stack_fffffffffffffb58);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_48);
  if (!bVar1) {
    local_a4 = 0x3f000000;
    local_a0 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                         ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffae0,
                          (float *)in_stack_fffffffffffffad8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffae0,
               (ConstantSpectrum **)in_stack_fffffffffffffad8);
    SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTexture *)in_stack_fffffffffffffad0,
               (SpectrumConstantTexture *)in_stack_fffffffffffffac8);
    SpectrumTexture::operator=
              ((SpectrumTexture *)in_stack_fffffffffffffad0,
               (SpectrumTexture *)in_stack_fffffffffffffac8);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  local_e0 = local_28;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  local_118 = local_28;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb38);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_b0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    local_150 = local_28;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (Float)((ulong)in_stack_fffffffffffffae0 >> 0x20),in_stack_fffffffffffffaf8);
    FloatTexture::operator=
              ((FloatTexture *)in_stack_fffffffffffffad0,(FloatTexture *)in_stack_fffffffffffffac8);
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator(&local_141);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_e8);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    local_188 = local_28;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
               (Float)((ulong)in_stack_fffffffffffffae0 >> 0x20),in_stack_fffffffffffffaf8);
    FloatTexture::operator=
              ((FloatTexture *)in_stack_fffffffffffffad0,(FloatTexture *)in_stack_fffffffffffffac8);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  local_1c0 = local_28;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (Float)((ulong)in_stack_fffffffffffffae0 >> 0x20),in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string(local_1b0);
  std::allocator<char>::~allocator(&local_1b1);
  Spectrum::Spectrum((Spectrum *)0x909b2f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  TextureParameterDictionary::GetFloatArray(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  bVar1 = std::vector<float,_std::allocator<float>_>::empty(in_stack_fffffffffffffae0);
  bVar2 = bVar1 ^ 0xff;
  std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffae0);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator(&local_201);
  if ((bVar2 & 1) == 0) {
    in_stack_fffffffffffffb80 = (FloatTexture *)&local_279;
    in_stack_fffffffffffffb78 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
    local_290 = local_28;
    TextureParameterDictionary::GetOneSpectrum
              ((TextureParameterDictionary *)in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,
               (Spectrum *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00),
               (SpectrumType)((ulong)in_stack_fffffffffffffaf8.memoryResource >> 0x20),
               in_stack_fffffffffffffb18);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffad0,(Spectrum *)in_stack_fffffffffffffac8)
    ;
    std::__cxx11::string::~string((string *)((long)&local_279 + 1));
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
  }
  else {
    in_stack_fffffffffffffb98 = &local_249;
    in_stack_fffffffffffffb90 = local_30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
               (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
    TextureParameterDictionary::GetFloatArray(in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
    std::vector<float,_std::allocator<float>_>::operator[](&local_228,0);
    in_stack_fffffffffffffb88 =
         pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float&>
                   ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffae0,
                    (float *)in_stack_fffffffffffffad8);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffffad0,(ConstantSpectrum *)in_stack_fffffffffffffac8);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffad0,(Spectrum *)in_stack_fffffffffffffac8)
    ;
    std::vector<float,_std::allocator<float>_>::~vector(in_stack_fffffffffffffae0);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_249);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    local_29c = 0x3fc00000;
    pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffae0,
               (float *)in_stack_fffffffffffffad8);
    Spectrum::TaggedPointer<pbrt::ConstantSpectrum>
              ((Spectrum *)in_stack_fffffffffffffad0,(ConstantSpectrum *)in_stack_fffffffffffffac8);
    Spectrum::operator=((Spectrum *)in_stack_fffffffffffffad0,(Spectrum *)in_stack_fffffffffffffac8)
    ;
  }
  args_5 = (FloatTexture *)&local_2c1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  iVar4 = TextureParameterDictionary::GetOneInt
                    ((TextureParameterDictionary *)in_stack_fffffffffffffad0,
                     in_stack_fffffffffffffac8,0);
  std::__cxx11::string::~string((string *)((long)&local_2c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2c1);
  alloc_01.memoryResource = (memory_resource *)&local_2e9;
  psVar6 = local_30;
  local_2a0 = iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  iVar4 = TextureParameterDictionary::GetOneInt
                    ((TextureParameterDictionary *)in_stack_fffffffffffffad0,
                     in_stack_fffffffffffffac8,0);
  std::__cxx11::string::~string((string *)((long)&local_2e9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_2e9);
  defaultValue = (Spectrum *)&local_319;
  alloc_00.memoryResource = (memory_resource *)local_30;
  local_2c8 = iVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  local_328 = local_28;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
             (Float)((ulong)in_stack_fffffffffffffae0 >> 0x20),in_stack_fffffffffffffaf8);
  std::__cxx11::string::~string((string *)((long)&local_319 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  this_00 = (TextureParameterDictionary *)local_351;
  name = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  Spectrum::TaggedPointer((Spectrum *)in_stack_fffffffffffffad0,in_stack_fffffffffffffac8);
  local_368 = local_28;
  TextureParameterDictionary::GetSpectrumTexture
            ((TextureParameterDictionary *)psVar6,
             (string *)CONCAT44(iVar4,in_stack_fffffffffffffb48),defaultValue,
             (SpectrumType)((ulong)alloc_00.memoryResource >> 0x20),alloc_01);
  std::__cxx11::string::~string((string *)(local_351 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_351);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_330);
  if (!bVar1) {
    local_37c = 0;
    local_378 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::ConstantSpectrum,float>
                          ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffae0,
                           (float *)in_stack_fffffffffffffad8);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffae0,
               (ConstantSpectrum **)in_stack_fffffffffffffad8);
    SpectrumTexture::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTexture *)in_stack_fffffffffffffad0,
               (SpectrumConstantTexture *)in_stack_fffffffffffffac8);
    SpectrumTexture::operator=
              ((SpectrumTexture *)in_stack_fffffffffffffad0,
               (SpectrumTexture *)in_stack_fffffffffffffac8);
  }
  args_2 = (FloatTexture *)&local_3a9;
  psVar6 = local_30;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffb10,(char *)in_stack_fffffffffffffb08,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  local_3b8 = local_28;
  TextureParameterDictionary::GetFloatTextureOrNull(this_00,name,alloc_00);
  std::__cxx11::string::~string((string *)((long)&local_3a9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)local_30,
             (allocator<char> *)CONCAT17(in_stack_fffffffffffffb07,in_stack_fffffffffffffb00));
  bVar3 = TextureParameterDictionary::GetOneBool
                    ((TextureParameterDictionary *)in_stack_fffffffffffffad0,
                     in_stack_fffffffffffffac8,false);
  std::__cxx11::string::~string((string *)(local_3e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3e1);
  local_3b9 = bVar3 & 1;
  pCVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CoatedDiffuseMaterial,pbrt::SpectrumTexture&,pbrt::FloatTexture&,pbrt::FloatTexture&,pbrt::FloatTexture&,pbrt::SpectrumTexture&,pbrt::FloatTexture&,pbrt::Spectrum&,pbrt::FloatTexture&,pbrt::Image*&,bool&,int&,int&>
                     ((polymorphic_allocator<std::byte> *)alloc_00.memoryResource,
                      (SpectrumTexture *)this_00,(FloatTexture *)name,args_2,(FloatTexture *)psVar6,
                      (SpectrumTexture *)this,args_5,(Spectrum *)in_stack_fffffffffffffb78,
                      in_stack_fffffffffffffb80,(Image **)in_stack_fffffffffffffb88,
                      (bool *)in_stack_fffffffffffffb90,(int *)in_stack_fffffffffffffb98,
                      (int *)CONCAT17(bVar2,in_stack_fffffffffffffba0));
  return pCVar5;
}

Assistant:

CoatedDiffuseMaterial *CoatedDiffuseMaterial::Create(
    const TextureParameterDictionary &parameters, Image *normalMap, const FileLoc *loc,
    Allocator alloc) {
    SpectrumTexture reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Albedo, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));

    FloatTexture uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTexture vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTexture thickness = parameters.GetFloatTexture("thickness", .01, alloc);

    Spectrum eta;
    if (!parameters.GetFloatArray("eta").empty())
        eta = alloc.new_object<ConstantSpectrum>(parameters.GetFloatArray("eta")[0]);
    else
        eta = parameters.GetOneSpectrum("eta", nullptr, SpectrumType::Unbounded, alloc);
    if (!eta)
        eta = alloc.new_object<ConstantSpectrum>(1.5f);

    int maxDepth = parameters.GetOneInt("maxdepth", 10);
    int nSamples = parameters.GetOneInt("nsamples", 1);

    FloatTexture g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTexture albedo =
        parameters.GetSpectrumTexture("albedo", nullptr, SpectrumType::Albedo, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTexture displacement = parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);

    return alloc.new_object<CoatedDiffuseMaterial>(
        reflectance, uRoughness, vRoughness, thickness, albedo, g, eta, displacement,
        normalMap, remapRoughness, maxDepth, nSamples);
}